

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *fadexpr)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double local_48;
  
  pFVar7 = (fadexpr->fadexpr_).right_;
  uVar1 = (pFVar7->fadexpr_).expr_.dx_.num_elts;
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00f1a32f;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00f1a32f;
    }
    if (uVar2 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar7 = (fadexpr->fadexpr_).right_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar10 = (ulong)uVar1 * 8;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = uVar10;
    }
    pdVar5 = (double *)operator_new__(uVar8);
    (this->dx_).ptr_to_data = pdVar5;
    if ((pFVar7->fadexpr_).expr_.dx_.num_elts == 0) {
      if (0 < (int)uVar1) {
        lVar9 = 0;
        do {
          pFVar7 = (fadexpr->fadexpr_).right_;
          pdVar6 = &(pFVar7->fadexpr_).expr_.defaultVal;
          if ((pFVar7->fadexpr_).expr_.dx_.num_elts != 0) {
            pdVar6 = (double *)((long)(pFVar7->fadexpr_).expr_.dx_.ptr_to_data + lVar9);
          }
          local_48 = -*pdVar6;
          dVar3 = sin((pFVar7->fadexpr_).expr_.val_);
          *(double *)((long)pdVar5 + lVar9) = dVar3 * local_48 * (fadexpr->fadexpr_).left_.constant_
          ;
          lVar9 = lVar9 + 8;
        } while (uVar10 - lVar9 != 0);
      }
      goto LAB_00f1a32f;
    }
  }
  if (0 < (int)uVar1) {
    uVar10 = 0;
    do {
      pFVar7 = (fadexpr->fadexpr_).right_;
      local_48 = -(pFVar7->fadexpr_).expr_.dx_.ptr_to_data[uVar10];
      dVar3 = sin((pFVar7->fadexpr_).expr_.val_);
      pdVar5[uVar10] = dVar3 * local_48 * (fadexpr->fadexpr_).left_.constant_;
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
LAB_00f1a32f:
  dVar3 = (fadexpr->fadexpr_).left_.constant_;
  dVar4 = cos((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar4 * dVar3;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}